

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enc.c
# Opt level: O0

void DCMode(uint8_t *dst,uint8_t *left,uint8_t *top,int size,int round,int shift)

{
  int in_ECX;
  long in_RDX;
  long in_RSI;
  int j;
  int DC;
  int in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  
  if (in_RDX == 0) {
    if (in_RSI != 0) {
      for (in_stack_ffffffffffffffd4 = 0; in_stack_ffffffffffffffd4 < in_ECX;
          in_stack_ffffffffffffffd4 = in_stack_ffffffffffffffd4 + 1) {
      }
    }
  }
  else {
    for (in_stack_ffffffffffffffd4 = 0; in_stack_ffffffffffffffd4 < in_ECX;
        in_stack_ffffffffffffffd4 = in_stack_ffffffffffffffd4 + 1) {
    }
    if (in_RSI != 0) {
      for (in_stack_ffffffffffffffd4 = 0; in_stack_ffffffffffffffd4 < in_ECX;
          in_stack_ffffffffffffffd4 = in_stack_ffffffffffffffd4 + 1) {
      }
    }
  }
  Fill((uint8_t *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
       in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8);
  return;
}

Assistant:

static WEBP_INLINE void DCMode(uint8_t* WEBP_RESTRICT dst,
                               const uint8_t* WEBP_RESTRICT left,
                               const uint8_t* WEBP_RESTRICT top,
                               int size, int round, int shift) {
  int DC = 0;
  int j;
  if (top != NULL) {
    for (j = 0; j < size; ++j) DC += top[j];
    if (left != NULL) {   // top and left present
      for (j = 0; j < size; ++j) DC += left[j];
    } else {      // top, but no left
      DC += DC;
    }
    DC = (DC + round) >> shift;
  } else if (left != NULL) {   // left but no top
    for (j = 0; j < size; ++j) DC += left[j];
    DC += DC;
    DC = (DC + round) >> shift;
  } else {   // no top, no left, nothing.
    DC = 0x80;
  }
  Fill(dst, DC, size);
}